

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFindInvalidData.cpp
# Opt level: O0

void __thiscall
utFindInvalidDataProcess_testStepNegativeResult_Test::TestBody
          (utFindInvalidDataProcess_testStepNegativeResult_Test *this)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  float _xyz;
  AssertHelper local_150;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_128 [4];
  uint i_1;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  uint i;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  undefined4 uStack_18;
  float local_14;
  utFindInvalidDataProcess_testStepNegativeResult_Test *this_local;
  
  paVar1 = (this->super_utFindInvalidDataProcess).mMesh;
  memset(paVar1->mNormals,0,(ulong)paVar1->mNumVertices * 0xc);
  paVar1 = (this->super_utFindInvalidDataProcess).mMesh;
  memset(paVar1->mBitangents,0,(ulong)paVar1->mNumVertices * 0xc);
  _xyz = std::numeric_limits<float>::quiet_NaN();
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&gtest_ar_.message_.ptr_ + 4),_xyz);
  paVar2 = ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords[2];
  paVar2[0x1c7].z = local_14;
  paVar2[0x1c7].x = (float)gtest_ar_.message_.ptr_._4_4_;
  paVar2[0x1c7].y = (float)uStack_18;
  Assimp::FindInvalidDataProcess::ProcessMesh
            ((this->super_utFindInvalidDataProcess).mProcess,
             (this->super_utFindInvalidDataProcess).mMesh);
  local_31 = ((this->super_utFindInvalidDataProcess).mMesh)->mVertices != (aiVector3D *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar3) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_30,
               (AssertionResult *)"NULL != mMesh->mVertices","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x76,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
            ((EqHelper<true> *)local_88,"__null","mMesh->mNormals",(Secret *)0x0,
             ((this->super_utFindInvalidDataProcess).mMesh)->mNormals);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar3) {
    testing::Message::Message(&local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x77,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
            ((EqHelper<true> *)local_a8,"__null","mMesh->mTangents",(Secret *)0x0,
             ((this->super_utFindInvalidDataProcess).mMesh)->mTangents);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar3) {
    testing::Message::Message(&local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
            ((EqHelper<true> *)local_c8,"__null","mMesh->mBitangents",(Secret *)0x0,
             ((this->super_utFindInvalidDataProcess).mMesh)->mBitangents);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar3) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff28,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff28);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  for (gtest_ar__1.message_.ptr_._4_4_ = 0; gtest_ar__1.message_.ptr_._4_4_ < 2;
      gtest_ar__1.message_.ptr_._4_4_ = gtest_ar__1.message_.ptr_._4_4_ + 1) {
    local_f1 = ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords
               [gtest_ar__1.message_.ptr_._4_4_] != (aiVector3D *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar3) {
      testing::Message::Message(&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_128,(internal *)local_f0,
                 (AssertionResult *)"NULL != mMesh->mTextureCoords[i]","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x7c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      std::__cxx11::string::~string((string *)local_128);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  }
  for (gtest_ar_3.message_.ptr_._4_4_ = 2; gtest_ar_3.message_.ptr_._4_4_ < 8;
      gtest_ar_3.message_.ptr_._4_4_ = gtest_ar_3.message_.ptr_._4_4_ + 1) {
    testing::internal::EqHelper<true>::Compare<aiVector3t<float>>
              ((EqHelper<true> *)local_140,"__null","mMesh->mTextureCoords[i]",(Secret *)0x0,
               ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords
               [gtest_ar_3.message_.ptr_._4_4_]);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar3) {
      testing::Message::Message(&local_148);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x80,pcVar4);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  }
  return;
}

Assistant:

TEST_F(utFindInvalidDataProcess, testStepNegativeResult) {
    ::memset(mMesh->mNormals, 0, mMesh->mNumVertices*sizeof(aiVector3D) );
    ::memset(mMesh->mBitangents, 0, mMesh->mNumVertices*sizeof(aiVector3D) );

    mMesh->mTextureCoords[2][455] = aiVector3D( std::numeric_limits<float>::quiet_NaN() );

    mProcess->ProcessMesh(mMesh);

    EXPECT_TRUE(NULL != mMesh->mVertices);
    EXPECT_EQ(NULL, mMesh->mNormals);
    EXPECT_EQ(NULL, mMesh->mTangents);
    EXPECT_EQ(NULL, mMesh->mBitangents);

    for (unsigned int i = 0; i < 2; ++i) {
        EXPECT_TRUE(NULL != mMesh->mTextureCoords[i]);
    }

    for (unsigned int i = 2; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        EXPECT_EQ(NULL, mMesh->mTextureCoords[i]);
    }
}